

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void iterator_suite::test_const_iterator_constructible(void)

{
  size_type *psVar1;
  bool bVar2;
  iterator begin;
  iterator end;
  iterator local_b8;
  basic_iterator<const_int> local_a8;
  undefined1 auStack_98 [8];
  const_iterator bravo;
  basic_iterator<const_int> local_78;
  iterator local_68;
  basic_iterator<const_int> local_58;
  undefined1 auStack_48 [8];
  const_iterator alpha;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  psVar1 = &span.member.next;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  psVar1 = &alpha.current;
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)psVar1,begin,end);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)psVar1,0xb);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)psVar1);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::
  basic_iterator<const_int,_0>(&local_58,&local_68);
  auStack_48 = (undefined1  [8])local_58.parent;
  alpha.parent = (view_pointer)local_58.current;
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)psVar1);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::
  basic_iterator<const_int,_0>(&local_78,(basic_iterator<int> *)&bravo.current);
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)auStack_48,&local_78);
  boost::detail::test_impl
            ("alpha == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x29c,"void iterator_suite::test_const_iterator_constructible()",bVar2);
  auStack_98 = auStack_48;
  bravo.parent = alpha.parent;
  local_b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)psVar1);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::
  basic_iterator<const_int,_0>(&local_a8,&local_b8);
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)auStack_98,&local_a8);
  boost::detail::test_impl
            ("bravo == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x29e,"void iterator_suite::test_const_iterator_constructible()",(bool)(-bVar2 & 1));
  return;
}

Assistant:

void test_const_iterator_constructible()
{
    // Also checks implicit conversion from iterator to const_iterator
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    decltype(span)::const_iterator alpha; // DefaultConstructible
    alpha = span.begin();
    BOOST_TEST(alpha == span.begin());
    decltype(span)::const_iterator bravo(alpha); // CopyConstructible
    BOOST_TEST(bravo == span.begin());
}